

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_ways.cxx
# Opt level: O3

void __thiscall
write_point_ini::operator()(write_point_ini *this,way_point_le *point,xr_ini_writer *w,uint32_t id)

{
  pointer pcVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  size_t sVar3;
  void *__buf;
  char buffer [128];
  long *local_c8 [2];
  long local_b8 [2];
  char local_a8 [128];
  
  sVar3 = CONCAT44(in_register_0000000c,id);
  iVar2 = snprintf(local_a8,0x80,"wp_%d_flags");
  if (0 < iVar2) {
    xray_re::xr_ini_writer::write
              (w,(int)local_a8,(void *)(ulong)(point->super_way_point).flags,sVar3);
  }
  iVar2 = snprintf(local_a8,0x80,"wp_%d_name");
  if (0 < iVar2) {
    pcVar1 = (point->super_way_point).name._M_dataplus._M_p;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,pcVar1,pcVar1 + (point->super_way_point).name._M_string_length);
    xray_re::xr_ini_writer::write(w,(int)local_a8,local_c8,0);
    if (local_c8[0] != local_b8) {
      operator_delete(local_c8[0],local_b8[0] + 1);
    }
  }
  sVar3 = (size_t)id;
  iVar2 = snprintf(local_a8,0x80,"wp_%d_pos");
  if (0 < iVar2) {
    xray_re::xr_ini_writer::write(w,(int)local_a8,__buf,sVar3);
  }
  iVar2 = snprintf(local_a8,0x80,"wp_%d_selected");
  if (0 < iVar2) {
    xray_re::xr_ini_writer::write(w,(int)local_a8,"off",0);
  }
  return;
}

Assistant:

void operator()(const way_point_le& point, xr_ini_writer* w, uint32_t id) const {
	char buffer[128];
	char* buf = &buffer[0];
	int n = xr_snprintf(buf, sizeof(buffer), "wp_%d_flags", id);
	if (n > 0)
		w->write(buf, point.flags);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_name", id);
	if (n > 0)
		w->write(buf, point.name, false);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_pos", id);
	if (n > 0)
		w->write(buf, point.position);

	n = xr_snprintf(buf, sizeof(buffer), "wp_%d_selected", id);
	if (n > 0)
		w->write(buf, "off", false);
}